

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::parse_some
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  bool *pbVar1;
  byte bVar2;
  csv_mode cVar3;
  byte *pbVar4;
  pointer pcVar5;
  iterator iVar6;
  m_columns_filter<char,_std::allocator<char>_> *visitor_00;
  bool bVar7;
  csv_parse_state cVar8;
  byte *pbVar9;
  csv_errc __e;
  iterator iVar10;
  char cVar11;
  csv_mode local_4c;
  string_type *local_48;
  vector<jsoncons::csv::csv_parse_state,std::allocator<jsoncons::csv::csv_parse_state>> *local_40;
  vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *local_38;
  
  visitor_00 = (m_columns_filter<char,_std::allocator<char>_> *)visitor;
  if (this->mapping_kind_ == m_columns) {
    this->cursor_mode_ = false;
    visitor_00 = &this->m_columns_filter_;
  }
  pbVar4 = (byte *)this->input_end_;
  if (((byte *)this->input_ptr_ != pbVar4) || (this->more_ != true)) goto LAB_002fc6f2;
  cVar8 = this->state_;
  if (before_last_unquoted_field_tail < cVar8) {
    if (cVar8 == before_last_quoted_field) {
      end_quoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      goto LAB_002fc6e6;
    }
    goto switchD_002fc5d5_caseD_1;
  }
  switch(cVar8) {
  case start:
    __e = source_error;
    break;
  default:
    goto switchD_002fc5d5_caseD_1;
  case end_record:
    if (this->column_index_ != 0) {
      end_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
    }
    this->state_ = no_more_records;
    goto LAB_002fc6f2;
  case no_more_records:
    pcVar5 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar5[-1] - header < 2) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar5 + -1;
    }
    (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])(visitor_00,this,ec);
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
    if (this->mapping_kind_ == m_columns) {
      this->level_ = this->level_ + -1;
LAB_002fd1b6:
      if ((this->m_columns_filter_).state_ != done) {
        bVar7 = detail::m_columns_filter<char,_std::allocator<char>_>::replay_parse_events
                          (&this->m_columns_filter_,visitor,this->actual_cursor_mode_,
                           this->mark_level_);
        this->more_ = bVar7;
        goto LAB_002fc6f2;
      }
    }
    else {
      if (this->level_ == this->mark_level_) {
        this->more_ = false;
      }
      this->level_ = this->level_ + -1;
      if (this->mapping_kind_ == m_columns) goto LAB_002fd1b6;
    }
    this->state_ = accept;
    goto LAB_002fc6f2;
  case unquoted_string:
    goto switchD_002fc5d5_caseD_9;
  case before_unquoted_string:
    (this->buffer_)._M_string_length = 0;
    *(this->buffer_)._M_dataplus._M_p = '\0';
switchD_002fc5d5_caseD_9:
    if ((this->trim_leading_ != false) || (this->trim_trailing_ == true)) {
      trim_string_buffer(this,this->trim_leading_,this->trim_trailing_);
    }
    if ((this->ignore_empty_values_ != true) || ((this->buffer_)._M_string_length != 0)) {
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_unquoted_field;
      goto LAB_002fc6f2;
    }
    goto switchD_002fc5d5_caseD_1;
  case escaped_value:
    if (this->quote_escape_char_ == this->quote_char_) {
      if ((this->ignore_empty_values_ != true) || ((this->buffer_)._M_string_length != 0)) {
        before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
        this->column_ = this->column_ + 1;
        this->state_ = before_last_quoted_field;
        goto LAB_002fc6f2;
      }
      goto switchD_002fc5d5_caseD_1;
    }
LAB_002fd154:
    __e = invalid_escaped_char;
    break;
  case accept:
    pcVar5 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (((long)pcVar5 -
         (long)(this->stack_).
               super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
               ._M_impl.super__Vector_impl_data._M_start == 4) && (pcVar5[-1] == initial)) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar5 + -1;
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[2])(visitor_00);
      this->state_ = done;
      goto LAB_002fd190;
    }
    local_4c = header;
    if ((this->err_handler_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_002fd24f:
      std::__throw_bad_function_call();
    }
    (*(this->err_handler_)._M_invoker)
              ((_Any_data *)&this->err_handler_,&local_4c,&this->super_ser_context);
    __e = unexpected_eof;
    break;
  case before_unquoted_field:
  case before_last_unquoted_field:
    end_unquoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    this->state_ = before_last_unquoted_field_tail;
    goto LAB_002fc6f2;
  case before_last_unquoted_field_tail:
    pcVar5 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar5[-1] == subfields) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar5 + -1;
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])
                (visitor_00,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      if ((this->mapping_kind_ != m_columns) && (this->level_ == this->mark_level_)) {
        this->more_ = false;
      }
      this->level_ = this->level_ + -1;
    }
LAB_002fc6e6:
    this->column_index_ = this->column_index_ + 1;
switchD_002fc5d5_caseD_1:
    this->state_ = end_record;
LAB_002fc6f2:
    pbVar9 = (byte *)this->input_ptr_;
    if (pbVar9 < pbVar4) {
      pbVar1 = &this->more_;
      local_40 = (vector<jsoncons::csv::csv_parse_state,std::allocator<jsoncons::csv::csv_parse_state>>
                  *)&this->state_stack_;
      local_48 = &this->buffer_;
      local_38 = &this->stack_;
      do {
        if (*pbVar1 != true) {
          return;
        }
        cVar3 = this->state_;
        if (0x20 < cVar3) {
switchD_002fc756_caseD_5:
          local_4c = 5;
          if ((this->err_handler_).super__Function_base._M_manager == (_Manager_type)0x0)
          goto LAB_002fd24f;
          (*(this->err_handler_)._M_invoker)
                    ((_Any_data *)&this->err_handler_,&local_4c,&this->super_ser_context);
          __e = invalid_parse_state;
          goto LAB_002fd18b;
        }
        bVar2 = *pbVar9;
        cVar11 = (char)local_48;
        switch(cVar3) {
        case initial:
          if (this->mapping_kind_ != m_columns) {
            (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
                      (visitor_00,0,this,ec);
            this->more_ = (bool)(this->cursor_mode_ ^ 1);
            this->level_ = this->level_ + 1;
          }
          if (((this->assume_header_ == true) && (this->mapping_kind_ == n_rows)) &&
             ((this->column_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (this->column_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            this->column_index_ = 0;
            (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
                      (visitor_00,0,this,ec);
            this->level_ = this->level_ + 1;
            this->more_ = (bool)(this->cursor_mode_ ^ 1);
          }
          this->state_ = expect_comment_or_record;
          break;
        case header:
          this->line_ = this->line_ + 1;
          this->column_ = 1;
          if (*pbVar9 == 10) {
            this->input_ptr_ = (char *)(pbVar9 + 1);
          }
          cVar8 = pop_state(this);
          this->state_ = cVar8;
          break;
        case data:
          (this->buffer_)._M_string_length = 0;
          *(this->buffer_)._M_dataplus._M_p = '\0';
          if (bVar2 == this->comment_starter_) {
            this->state_ = comment;
            goto LAB_002fcb9b;
          }
          this->state_ = expect_record;
          break;
        case subfields:
          if (bVar2 < 0xd) {
            if (bVar2 == 9) goto LAB_002fcc91;
            if (bVar2 != 10) goto LAB_002fce64;
            if (this->ignore_empty_lines_ == false) goto LAB_002fcebd;
            this->line_ = this->line_ + 1;
            this->column_ = 1;
            this->state_ = expect_comment_or_record;
LAB_002fcceb:
            this->input_ptr_ = (char *)(pbVar9 + 1);
          }
          else {
            if (bVar2 != 0xd) {
              if (bVar2 != 0x20) {
LAB_002fce64:
                begin_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
                if (bVar2 == this->quote_char_) goto LAB_002fcff3;
                goto LAB_002fcaef;
              }
LAB_002fcc91:
              if (this->trim_leading_ == false) {
                std::__cxx11::string::push_back(cVar11);
                begin_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
                this->state_ = unquoted_string;
              }
              goto LAB_002fcb9b;
            }
            if (this->ignore_empty_lines_ == false) {
LAB_002fcebd:
              begin_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
              goto LAB_002fc7b1;
            }
            this->input_ptr_ = (char *)(pbVar9 + 1);
            iVar10._M_current =
                 (this->state_stack_).
                 super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_4c = cVar3;
            if (iVar10._M_current ==
                (this->state_stack_).
                super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<jsoncons::csv::csv_parse_state,std::allocator<jsoncons::csv::csv_parse_state>>
              ::_M_realloc_insert<jsoncons::csv::csv_parse_state_const&>(local_40,iVar10,&local_4c);
            }
            else {
              *iVar10._M_current = cVar3;
              (this->state_stack_).
              super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar10._M_current + 1;
            }
            this->state_ = cr;
          }
          break;
        case 4:
          if (bVar2 < 0xd) {
            if (bVar2 == 9) {
LAB_002fcce7:
              this->column_ = this->column_ + 1;
              goto LAB_002fcceb;
            }
            if (bVar2 == 10) {
              this->line_ = this->line_ + 1;
              this->column_ = 1;
              this->state_ = expect_comment_or_record;
              end_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
              goto LAB_002fcb9f;
            }
          }
          else {
            if (bVar2 == 0xd) {
              this->line_ = this->line_ + 1;
              this->column_ = 1;
              this->state_ = expect_comment_or_record;
              end_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
              local_4c = this->state_;
              iVar10._M_current =
                   (this->state_stack_).
                   super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar10._M_current ==
                  (this->state_stack_).
                  super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_002fce48;
              *iVar10._M_current = local_4c;
LAB_002fce3b:
              (this->state_stack_).
              super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar10._M_current + 1;
              goto LAB_002fce57;
            }
            if (bVar2 == 0x20) goto LAB_002fcce7;
          }
          local_4c = 4;
          if ((this->err_handler_).super__Function_base._M_manager == (_Manager_type)0x0)
          goto LAB_002fd24f;
          (*(this->err_handler_)._M_invoker)
                    ((_Any_data *)&this->err_handler_,&local_4c,&this->super_ser_context);
          __e = syntax_error;
          goto LAB_002fd18b;
        default:
          goto switchD_002fc756_caseD_5;
        case 6:
          if (bVar2 == 0xd) {
            this->line_ = this->line_ + 1;
            if ((this->stack_).
                super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1] == header) {
              this->header_line_offset_ = this->header_line_offset_ + 1;
            }
            this->column_ = 1;
            this->state_ = expect_comment_or_record;
            local_4c = data;
            iVar10._M_current =
                 (this->state_stack_).
                 super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current !=
                (this->state_stack_).
                super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              *iVar10._M_current = data;
              goto LAB_002fce3b;
            }
LAB_002fce48:
            std::
            vector<jsoncons::csv::csv_parse_state,std::allocator<jsoncons::csv::csv_parse_state>>::
            _M_realloc_insert<jsoncons::csv::csv_parse_state_const&>(local_40,iVar10,&local_4c);
LAB_002fce57:
            this->state_ = cr;
          }
          else {
            if (bVar2 != 10) goto LAB_002fcb9b;
            this->line_ = this->line_ + 1;
            if ((this->stack_).
                super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1] == header) {
              this->header_line_offset_ = this->header_line_offset_ + 1;
            }
            this->column_ = 1;
            this->state_ = expect_comment_or_record;
          }
          goto LAB_002fcb9f;
        case 7:
          if ((bVar2 == 0xd) || (bVar2 == 10)) {
            if ((this->trim_leading_ != false) || (this->trim_trailing_ == true)) {
              trim_string_buffer(this,this->trim_leading_,this->trim_trailing_);
            }
            if ((this->ignore_empty_values_ == true) && ((this->buffer_)._M_string_length == 0))
            goto LAB_002fc7b1;
            before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
            this->state_ = before_last_quoted_field;
          }
          else if (bVar2 == this->field_delimiter_) {
            if ((this->trim_leading_ != false) || (this->trim_trailing_ == true)) {
              trim_string_buffer(this,this->trim_leading_,this->trim_trailing_);
            }
            before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
            this->state_ = before_quoted_field;
          }
          else {
            if ((this->subfield_delimiter_ == 0) || (bVar2 != this->subfield_delimiter_)) {
              if ((bVar2 == 0x20) || (bVar2 == 9)) goto LAB_002fcce7;
              __e = unexpected_char_between_fields;
              goto LAB_002fd18b;
            }
            if ((this->trim_leading_ != false) || (this->trim_trailing_ == true)) {
              trim_string_buffer(this,this->trim_leading_,this->trim_trailing_);
            }
            before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
            this->state_ = before_quoted_subfield;
          }
          break;
        case 8:
          if (bVar2 == this->quote_escape_char_) {
            this->state_ = escaped_value;
          }
          else if (bVar2 == this->quote_char_) {
            this->state_ = between_values;
          }
          else {
LAB_002fd015:
            std::__cxx11::string::push_back(cVar11);
          }
          goto LAB_002fcb9b;
        case 9:
          if ((bVar2 == 0xd) || (bVar2 == 10)) {
            if ((this->trim_leading_ != false) || (this->trim_trailing_ == true)) {
              trim_string_buffer(this,this->trim_leading_,this->trim_trailing_);
            }
            if ((this->ignore_empty_values_ == true) && ((this->buffer_)._M_string_length == 0))
            goto LAB_002fc7b1;
            before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
            this->state_ = before_last_unquoted_field;
          }
          else if (bVar2 == this->field_delimiter_) {
            if ((this->trim_leading_ != false) || (this->trim_trailing_ == true)) {
              trim_string_buffer(this,this->trim_leading_,this->trim_trailing_);
            }
            before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
            this->state_ = before_unquoted_field;
          }
          else {
            if ((this->subfield_delimiter_ == 0) || (bVar2 != this->subfield_delimiter_)) {
              if (bVar2 != this->quote_char_) goto LAB_002fd015;
LAB_002fcff3:
              (this->buffer_)._M_string_length = 0;
              *(this->buffer_)._M_dataplus._M_p = '\0';
              goto LAB_002fd008;
            }
            if ((this->trim_leading_ != false) || (this->trim_trailing_ == true)) {
              trim_string_buffer(this,this->trim_leading_,this->trim_trailing_);
            }
            before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
            this->state_ = before_unquoted_subfield;
          }
          break;
        case 10:
          (this->buffer_)._M_string_length = 0;
          *(this->buffer_)._M_dataplus._M_p = '\0';
LAB_002fcaef:
          this->state_ = unquoted_string;
          break;
        case 0xb:
          if (bVar2 == this->quote_char_) {
            std::__cxx11::string::push_back(cVar11);
LAB_002fd008:
            this->state_ = quoted_string;
            goto LAB_002fcb9b;
          }
          if (this->quote_escape_char_ != this->quote_char_) goto LAB_002fd154;
          this->state_ = between_values;
          break;
        case 0x14:
          end_unquoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
          goto LAB_002fc9cf;
        case 0x15:
          pcVar5 = (this->stack_).
                   super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pcVar5[-1] == subfields) {
            (this->stack_).
            super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
            _M_impl.super__Vector_impl_data._M_finish = pcVar5 + -1;
            (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])
                      (visitor_00,this,ec);
            this->more_ = (bool)(this->cursor_mode_ ^ 1);
            if ((this->mapping_kind_ != m_columns) && (this->level_ == this->mark_level_)) {
              *pbVar1 = false;
            }
            this->level_ = this->level_ + -1;
          }
          this->column_index_ = this->column_index_ + 1;
          goto LAB_002fcb93;
        case 0x16:
          pcVar5 = (this->stack_).
                   super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pcVar5[-1] == subfields) {
            (this->stack_).
            super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
            _M_impl.super__Vector_impl_data._M_finish = pcVar5 + -1;
            (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])
                      (visitor_00,this,ec);
            this->more_ = (bool)(this->cursor_mode_ ^ 1);
            if ((this->mapping_kind_ != m_columns) && (this->level_ == this->mark_level_)) {
              *pbVar1 = false;
            }
            this->level_ = this->level_ + -1;
          }
          this->state_ = end_record;
          goto LAB_002fcb9b;
        case 0x17:
          end_unquoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
          this->state_ = before_last_unquoted_field_tail;
          break;
        case 0x18:
        case 0x20:
          pcVar5 = (this->stack_).
                   super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pcVar5[-1] == subfields) {
            (this->stack_).
            super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
            _M_impl.super__Vector_impl_data._M_finish = pcVar5 + -1;
            (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])
                      (visitor_00,this,ec);
            this->more_ = (bool)(this->cursor_mode_ ^ 1);
            if ((this->mapping_kind_ != m_columns) && (this->level_ == this->mark_level_)) {
              *pbVar1 = false;
            }
            this->level_ = this->level_ + -1;
          }
          this->column_index_ = this->column_index_ + 1;
LAB_002fc7b1:
          this->state_ = end_record;
          break;
        case 0x19:
          iVar6._M_current =
               (this->stack_).
               super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar6._M_current[-1] == data) {
            local_4c = subfields;
            if (iVar6._M_current ==
                (this->stack_).
                super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
              _M_realloc_insert<jsoncons::csv::csv_mode>(local_38,iVar6,&local_4c);
            }
            else {
              *iVar6._M_current = subfields;
              (this->stack_).
              super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
            }
            (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
                      (visitor_00,0,this,ec);
            this->more_ = (bool)(this->cursor_mode_ ^ 1);
            this->level_ = this->level_ + 1;
          }
          this->state_ = before_unquoted_subfield_tail;
          break;
        case 0x1a:
          end_unquoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
          goto LAB_002fcb93;
        case 0x1b:
          iVar6._M_current =
               (this->stack_).
               super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar6._M_current[-1] == data) {
            local_4c = subfields;
            if (iVar6._M_current ==
                (this->stack_).
                super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
              _M_realloc_insert<jsoncons::csv::csv_mode>(local_38,iVar6,&local_4c);
            }
            else {
              *iVar6._M_current = subfields;
              (this->stack_).
              super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
            }
            (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
                      (visitor_00,0,this,ec);
            this->more_ = (bool)(this->cursor_mode_ ^ 1);
            this->level_ = this->level_ + 1;
          }
          this->state_ = before_quoted_subfield_tail;
          break;
        case 0x1c:
          end_quoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
LAB_002fcb93:
          this->state_ = before_unquoted_string;
LAB_002fcb9b:
          this->column_ = this->column_ + 1;
LAB_002fcb9f:
          this->input_ptr_ = this->input_ptr_ + 1;
          break;
        case 0x1d:
          end_quoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
LAB_002fc9cf:
          this->state_ = before_unquoted_field_tail;
          break;
        case 0x1f:
          end_quoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
          this->state_ = before_last_quoted_field_tail;
        }
        if (this->max_lines_ < this->line_) {
          this->state_ = done;
          this->more_ = false;
        }
        pbVar9 = (byte *)this->input_ptr_;
      } while (pbVar9 < pbVar4);
    }
    return;
  }
LAB_002fd18b:
  std::error_code::operator=(ec,__e);
LAB_002fd190:
  this->more_ = false;
  return;
}

Assistant:

void parse_some(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        basic_json_visitor<CharT>& local_visitor = (mapping_kind_ == csv_mapping_kind::m_columns) 
            ? m_columns_filter_ : visitor;

        switch (mapping_kind_)
        {
            case csv_mapping_kind::m_columns:
                cursor_mode_ = false;
                break;
            default:
                break;
        } 

        const CharT* local_input_end = input_end_;

        if (input_ptr_ == local_input_end && more_)
        {
            switch (state_)
            {
                case csv_parse_state::start:
                    ec = csv_errc::source_error;
                    more_ = false;
                    return;
                case csv_parse_state::before_unquoted_field:
                case csv_parse_state::before_last_unquoted_field:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_last_unquoted_field_tail;
                    break;
                case csv_parse_state::before_last_unquoted_field_tail:
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;
                case csv_parse_state::before_unquoted_string: 
                    buffer_.clear();
                    JSONCONS_FALLTHROUGH;
                case csv_parse_state::unquoted_string: 
                    if (trim_leading_ || trim_trailing_)
                    {
                        trim_string_buffer(trim_leading_,trim_trailing_);
                    }
                    if (ignore_empty_values_ && buffer_.empty())
                    {
                        state_ = csv_parse_state::end_record;
                    }
                    else
                    {
                        before_value(local_visitor, ec);
                        state_ = csv_parse_state::before_unquoted_field;
                    }
                    break;
                case csv_parse_state::before_last_quoted_field:
                    end_quoted_string_value(local_visitor, ec);
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;
                case csv_parse_state::escaped_value:
                    if (quote_escape_char_ == quote_char_)
                    {
                        if (!(ignore_empty_values_ && buffer_.empty()))
                        {
                            before_value(local_visitor, ec);
                            ++column_;
                            state_ = csv_parse_state::before_last_quoted_field;
                        }
                        else
                        {
                            state_ = csv_parse_state::end_record;
                        }
                    }
                    else
                    {
                        ec = csv_errc::invalid_escaped_char;
                        more_ = false;
                        return;
                    }
                    break;
                case csv_parse_state::end_record:
                    if (column_index_ > 0)
                    {
                        end_record(local_visitor, ec);
                    }
                    state_ = csv_parse_state::no_more_records;
                    break;
                case csv_parse_state::no_more_records: 
                    switch (stack_.back()) 
                    {
                        case csv_mode::header:
                            stack_.pop_back();
                            break;
                        case csv_mode::data:
                            stack_.pop_back();
                            break;
                        default:
                            break;
                    }
                    local_visitor.end_array(*this, ec);
                    more_ = !cursor_mode_;
                    if (mapping_kind_ != csv_mapping_kind::m_columns)
                    {
                        if (level() == mark_level_)
                        {
                            more_ = false;
                        }
                    }
                    --level_;
                    
                    if (mapping_kind_ == csv_mapping_kind::m_columns)
                    {
                        if (!m_columns_filter_.done())
                        {
                            more_ = m_columns_filter_.replay_parse_events(visitor, actual_cursor_mode_, mark_level_);
                        }
                        else
                        {
                            state_ = csv_parse_state::accept;
                        }
                    }
                    else
                    {
                        state_ = csv_parse_state::accept;
                    }
                    break;
                case csv_parse_state::accept:
                    if (!(stack_.size() == 1 && stack_.back() == csv_mode::initial))
                    {
                        err_handler_(csv_errc::unexpected_eof, *this);
                        ec = csv_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    stack_.pop_back();
                    local_visitor.flush();
                    state_ = csv_parse_state::done;
                    more_ = false;
                    return;
                default:
                    state_ = csv_parse_state::end_record;
                    break;
            }
        }

        for (; (input_ptr_ < local_input_end) && more_;)
        {
            CharT curr_char = *input_ptr_;

            switch (state_) 
            {
                case csv_parse_state::cr:
                    ++line_;
                    column_ = 1;
                    switch (*input_ptr_)
                    {
                        case '\n':
                            ++input_ptr_;
                            state_ = pop_state();
                            break;
                        default:
                            state_ = pop_state();
                            break;
                    }
                    break;
                case csv_parse_state::start:
                    if (mapping_kind_ != csv_mapping_kind::m_columns)
                    {
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                    }
                    if (assume_header_ && mapping_kind_ == csv_mapping_kind::n_rows && !column_names_.empty())
                    {
                        column_index_ = 0; 
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        ++level_;
                        more_ = !cursor_mode_;
                        state_ = csv_parse_state::expect_comment_or_record;
                    }
                    else
                    {
                        state_ = csv_parse_state::expect_comment_or_record;
                    }
                    break;
                case csv_parse_state::comment: 
                    switch (curr_char)
                    {
                        case '\n':
                        {
                            ++line_;
                            if (stack_.back() == csv_mode::header)
                            {
                                ++header_line_offset_;
                            }
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            break;
                        }
                        case '\r':
                            ++line_;
                            if (stack_.back() == csv_mode::header)
                            {
                                ++header_line_offset_;
                            }
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            push_state(state_);
                            state_ = csv_parse_state::cr;
                            break;
                        default:
                            ++column_;
                            break;
                    }
                    ++input_ptr_;
                    break;
                
                case csv_parse_state::expect_comment_or_record:
                    buffer_.clear();
                    if (curr_char == comment_starter_)
                    {
                        state_ = csv_parse_state::comment;
                        ++column_;
                        ++input_ptr_;
                    }
                    else
                    {
                        state_ = csv_parse_state::expect_record;
                    }
                    break;
                case csv_parse_state::quoted_string: 
                    {
                        if (curr_char == quote_escape_char_)
                        {
                            state_ = csv_parse_state::escaped_value;
                        }
                        else if (curr_char == quote_char_)
                        {
                            state_ = csv_parse_state::between_values;
                        }
                        else
                        {
                            buffer_.push_back(static_cast<CharT>(curr_char));
                        }
                    }
                    ++column_;
                    ++input_ptr_;
                    break;
                case csv_parse_state::escaped_value: 
                    {
                        if (curr_char == quote_char_)
                        {
                            buffer_.push_back(static_cast<CharT>(curr_char));
                            state_ = csv_parse_state::quoted_string;
                            ++column_;
                            ++input_ptr_;
                        }
                        else if (quote_escape_char_ == quote_char_)
                        {
                            state_ = csv_parse_state::between_values;
                        }
                        else
                        {
                            ec = csv_errc::invalid_escaped_char;
                            more_ = false;
                            return;
                        }
                    }
                    break;
                case csv_parse_state::between_values:
                    switch (curr_char)
                    {
                        case '\r':
                        case '\n':
                        {
                            if (trim_leading_ || trim_trailing_)
                            {
                                trim_string_buffer(trim_leading_,trim_trailing_);
                            }
                            if (!(ignore_empty_values_ && buffer_.empty()))
                            {
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_last_quoted_field;
                            }
                            else
                            {
                                state_ = csv_parse_state::end_record;
                            }
                            break;
                        }
                        default:
                            if (curr_char == field_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_quoted_field;
                            }
                            else if (subfield_delimiter_ != char_type() && curr_char == subfield_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_quoted_subfield;
                            }
                            else if (curr_char == ' ' || curr_char == '\t')
                            {
                                ++column_;
                                ++input_ptr_;
                            }
                            else
                            {
                                ec = csv_errc::unexpected_char_between_fields;
                                more_ = false;
                                return;
                            }
                            break;
                    }
                    break;
                case csv_parse_state::before_unquoted_string: 
                {
                    buffer_.clear();
                    state_ = csv_parse_state::unquoted_string;
                    break;
                }
                case csv_parse_state::before_unquoted_field:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_field_tail;
                    break;
                case csv_parse_state::before_unquoted_field_tail:
                {
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::before_unquoted_string;
                    ++column_;
                    ++input_ptr_;
                    break;
                }
                case csv_parse_state::before_unquoted_field_tail1:
                {
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    state_ = csv_parse_state::end_record;
                    ++column_;
                    ++input_ptr_;
                    break;
                }

                case csv_parse_state::before_last_unquoted_field:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_last_unquoted_field_tail;
                    break;

                case csv_parse_state::before_last_unquoted_field_tail:
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;

                case csv_parse_state::before_unquoted_subfield:
                    if (stack_.back() == csv_mode::data)
                    {
                        stack_.push_back(csv_mode::subfields);
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                    }
                    state_ = csv_parse_state::before_unquoted_subfield_tail;
                    break; 
                case csv_parse_state::before_unquoted_subfield_tail:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_string;
                    ++column_;
                    ++input_ptr_;
                    break;
                case csv_parse_state::before_quoted_field:
                    end_quoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_field_tail; // return to unquoted
                    break;
                case csv_parse_state::before_quoted_subfield:
                    if (stack_.back() == csv_mode::data)
                    {
                        stack_.push_back(csv_mode::subfields);
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                    }
                    state_ = csv_parse_state::before_quoted_subfield_tail;
                    break; 
                case csv_parse_state::before_quoted_subfield_tail:
                    end_quoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_string;
                    ++column_;
                    ++input_ptr_;
                    break;
                case csv_parse_state::before_last_quoted_field:
                    end_quoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_last_quoted_field_tail;
                    break;
                case csv_parse_state::before_last_quoted_field_tail:
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;
                case csv_parse_state::unquoted_string: 
                {
                    switch (curr_char)
                    {
                        case '\n':
                        case '\r':
                        {
                            if (trim_leading_ || trim_trailing_)
                            {
                                trim_string_buffer(trim_leading_,trim_trailing_);
                            }
                            if (!(ignore_empty_values_ && buffer_.empty()))
                            {
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_last_unquoted_field;
                            }
                            else
                            {
                                state_ = csv_parse_state::end_record;
                            }
                            break;
                        }
                        default:
                            if (curr_char == field_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_unquoted_field;
                            }
                            else if (subfield_delimiter_ != char_type() && curr_char == subfield_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_unquoted_subfield;
                            }
                            else if (curr_char == quote_char_)
                            {
                                buffer_.clear();
                                state_ = csv_parse_state::quoted_string;
                                ++column_;
                                ++input_ptr_;
                            }
                            else
                            {
                                buffer_.push_back(static_cast<CharT>(curr_char));
                                ++column_;
                                ++input_ptr_;
                            }
                            break;
                    }
                    break;
                }
                case csv_parse_state::expect_record: 
                {
                    switch (curr_char)
                    {
                        case '\n':
                        {
                            if (!ignore_empty_lines_)
                            {
                                begin_record(local_visitor, ec);
                                state_ = csv_parse_state::end_record;
                            }
                            else
                            {
                                ++line_;
                                column_ = 1;
                                state_ = csv_parse_state::expect_comment_or_record;
                                ++input_ptr_;
                            }
                            break;
                        }
                        case '\r':
                            if (!ignore_empty_lines_)
                            {
                                begin_record(local_visitor, ec);
                                state_ = csv_parse_state::end_record;
                            }
                            else
                            {
                                ++input_ptr_;
                                push_state(state_);
                                state_ = csv_parse_state::cr;
                            }
                            break;
                        case ' ':
                        case '\t':
                            if (!trim_leading_)
                            {
                                buffer_.push_back(static_cast<CharT>(curr_char));
                                begin_record(local_visitor, ec);
                                state_ = csv_parse_state::unquoted_string;
                            }
                            ++column_;
                            ++input_ptr_;
                            break;
                        default:
                            begin_record(local_visitor, ec);
                            if (curr_char == quote_char_)
                            {
                                buffer_.clear();
                                state_ = csv_parse_state::quoted_string;
                                ++column_;
                                ++input_ptr_;
                            }
                            else
                            {
                                state_ = csv_parse_state::unquoted_string;
                            }
                            break;
                        }
                    break;
                    }
                case csv_parse_state::end_record: 
                {
                    switch (curr_char)
                    {
                        case '\n':
                        {
                            ++line_;
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            end_record(local_visitor, ec);
                            ++input_ptr_;
                            break;
                        }
                        case '\r':
                            ++line_;
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            end_record(local_visitor, ec);
                            push_state(state_);
                            state_ = csv_parse_state::cr;
                            ++input_ptr_;
                            break;
                        case ' ':
                        case '\t':
                            ++column_;
                            ++input_ptr_;
                            break;
                        default:
                            err_handler_(csv_errc::syntax_error, *this);
                            ec = csv_errc::syntax_error;
                            more_ = false;
                            return;
                        }
                    break;
                }
                default:
                    err_handler_(csv_errc::invalid_parse_state, *this);
                    ec = csv_errc::invalid_parse_state;
                    more_ = false;
                    return;
            }
            if (line_ > max_lines_)
            {
                state_ = csv_parse_state::done;
                more_ = false;
            }
        }
    }